

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProduct::IfcProduct(IfcProduct *this)

{
  *(undefined ***)&this->field_0x100 = &PTR__Object_008278a0;
  *(undefined8 *)&this->field_0x108 = 0;
  *(char **)&this->field_0x110 = "IfcProduct";
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__008308c8);
  *(undefined8 *)&(this->super_IfcObject).field_0xd8 = 0;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0;
  *(undefined8 *)&this->super_IfcObject = 0x830810;
  *(undefined8 *)&this->field_0x100 = 0x8308b0;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x830838;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x830860;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0x830888;
  this->field_0xe8 = 0;
  (this->Representation).ptr.obj = (LazyObject *)0x0;
  (this->Representation).have = false;
  return;
}

Assistant:

IfcProduct() : Object("IfcProduct") {}